

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Model::set_allocated_custommodel(Model *this,CustomModel *custommodel)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_Type(this);
  if (custommodel != (CustomModel *)0x0) {
    submessage_arena = (Arena *)(custommodel->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 2) == 0) {
      if (((ulong)submessage_arena & 1) != 0) {
        submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffc);
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      custommodel = (CustomModel *)
                    google::protobuf::internal::GetOwnedMessageInternal
                              (message_arena,&custommodel->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 0x22b;
    (this->Type_).custommodel_ = custommodel;
  }
  return;
}

Assistant:

void Model::set_allocated_custommodel(::CoreML::Specification::CustomModel* custommodel) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (custommodel) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(custommodel));
    if (message_arena != submessage_arena) {
      custommodel = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, custommodel, submessage_arena);
    }
    set_has_custommodel();
    Type_.custommodel_ = custommodel;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Model.customModel)
}